

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.h
# Opt level: O2

Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_proto2_unittest::MessageContainingEnumCalledType>
* __thiscall
google::protobuf::internal::
TypeDefinedMapFieldBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_proto2_unittest::MessageContainingEnumCalledType>
::MutableMap(TypeDefinedMapFieldBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_proto2_unittest::MessageContainingEnumCalledType>
             *this)

{
  MapFieldBase::SyncMapWithRepeatedField(&this->super_MapFieldBase);
  MapFieldBase::SetMapDirty(&this->super_MapFieldBase);
  return (Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_proto2_unittest::MessageContainingEnumCalledType>
          *)&this->field_0;
}

Assistant:

Map<Key, T>* MutableMap() {
    SyncMapWithRepeatedField();
    SetMapDirty();
    return &map_;
  }